

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O1

errr init_x11(wchar_t argc,char **argv)

{
  byte bVar1;
  int16_t iVar2;
  int iVar3;
  long *plVar4;
  wchar_t wVar5;
  infofnt *piVar6;
  _Bool _Var7;
  wchar_t wVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  wchar_t wVar13;
  int iVar14;
  ang_file *paVar15;
  ushort **ppuVar16;
  Display *pDVar17;
  XkbDescPtr xkb;
  char *pcVar18;
  XFontSet p_Var19;
  long lVar20;
  infowin *piVar21;
  Window WVar22;
  XClassHint *pXVar23;
  __int32_t **pp_Var24;
  XSizeHints *pXVar25;
  byte *pbVar26;
  int iVar27;
  wchar_t wVar28;
  Pixell PVar29;
  uint8_t uVar30;
  wchar_t wVar31;
  ulong uVar32;
  errr eVar33;
  char *pcVar34;
  infowin *iwin;
  uint8_t uVar35;
  Pixell PVar36;
  Pixell PVar37;
  infoclr **ppiVar38;
  ulong uVar39;
  term_data *t;
  uint uVar40;
  infofnt *ifnt;
  int local_a70;
  wchar_t local_a6c;
  wchar_t local_a68;
  int local_a64;
  wchar_t missing_count;
  char *local_a48;
  char **missing;
  uint b;
  uint h;
  uint w;
  ulong local_a28;
  undefined1 local_a1c [4];
  char res_class [20];
  char res_name [20];
  int local_99c;
  long local_990;
  char cmd [40];
  char local_938 [256];
  char buf [1024];
  char buf_1 [1024];
  
  if (argc < L'\x02') {
    pcVar34 = "";
    wVar13 = L'\xffffffff';
  }
  else {
    wVar13 = L'\xffffffff';
    pcVar34 = "";
    uVar39 = 1;
    do {
      _Var7 = prefix(argv[uVar39],"-d");
      if (_Var7) {
        pcVar34 = argv[uVar39] + 2;
      }
      else {
        _Var7 = prefix(argv[uVar39],"-n");
        if (_Var7) {
          wVar8 = atoi(argv[uVar39] + 2);
          wVar13 = L'\b';
          if ((wVar8 < L'\t') && (wVar13 = wVar8, wVar8 < L'\x02')) {
            wVar13 = L'\x01';
          }
        }
        else {
          _Var7 = prefix(argv[uVar39],"-x");
          if (_Var7) {
            x11_prefs = argv[uVar39] + 2;
          }
          else {
            plog_fmt("Ignoring option: %s");
          }
        }
      }
      uVar39 = uVar39 + 1;
    } while ((uint)argc != uVar39);
  }
  if (wVar13 == L'\xffffffff') {
    path_build(settings,0x400,ANGBAND_DIR_USER,"x11-settings.prf");
    wVar13 = L'\x01';
    paVar15 = file_open(settings,MODE_READ,FTYPE_TEXT);
    if (paVar15 != (ang_file *)0x0) {
      _Var7 = file_getl(paVar15,buf,0x400);
      wVar13 = L'\x01';
      if (_Var7) {
        wVar13 = L'\x01';
        do {
          uVar39 = (ulong)(byte)buf[0];
          if ((((uVar39 != 0) && (ppuVar16 = __ctype_b_loc(), uVar39 != 0x23)) &&
              (((*ppuVar16)[uVar39] & 0x2000) == 0)) && (_Var7 = prefix(buf,"TERM_WINS"), _Var7)) {
            pcVar18 = strchr(buf,0x3d);
            if (pcVar18 == (char *)0x0) {
              wVar8 = L'\xffffffff';
            }
            else {
              wVar8 = atoi(pcVar18 + 1);
            }
            if (L'\0' < wVar8) {
              wVar13 = wVar8;
            }
          }
          _Var7 = file_getl(paVar15,buf,0x400);
        } while (_Var7);
      }
      file_close(paVar15);
    }
  }
  pDVar17 = (Display *)XOpenDisplay(pcVar34);
  eVar33 = -1;
  if (pDVar17 != (Display *)0x0) {
    metadpy_default_16 = metadpy_default_16 | 4;
    metadpy_default_1 = *(long *)(pDVar17 + 0xe8) + (long)*(int *)(pDVar17 + 0xe0) * 0x80;
    metadpy_default_2 =
         *(undefined8 *)(*(long *)(pDVar17 + 0xe8) + 0x10 + (long)*(int *)(pDVar17 + 0xe0) * 0x80);
    metadpy_default_4 = 8;
    metadpy_default_5 = 0x40;
    metadpy_default_0 = pDVar17;
    xkb = (XkbDescPtr)XkbGetKeyboard(pDVar17,0x7f,0x100);
    if (xkb != (XkbDescPtr)0x0) {
      metadpy_default_4 = xkb_mask_modifier(xkb,"Alt");
      metadpy_default_5 = xkb_mask_modifier(xkb,"Super");
      XkbFreeKeyboard(xkb,0,1);
    }
    metadpy_default_6 = *(undefined8 *)(pDVar17 + 0xd8);
    uVar40 = *(uint *)(metadpy_default_1 + 0x38);
    metadpy_default_16 = metadpy_default_16 & 0xfc | (uVar40 >= 2) * '\x02' | uVar40 < 2;
    PVar29 = *(Pixell *)(metadpy_default_1 + 0x60);
    metadpy_default_14 = *(Pixell *)(metadpy_default_1 + 0x58);
    metadpy_default_15 = ~(-1L << ((byte)uVar40 & 0x3f));
    metadpy_default_13 = PVar29;
    if (pDVar17 != (Display *)0x0) {
      term_windows_open = wVar13;
      xor = (infoclr *)mem_zalloc(0x20);
      PVar37 = metadpy_default_14;
      PVar36 = metadpy_default_13;
      Infoclr = xor;
      wVar8 = Infoclr_Opcode("xor");
      Infoclr_init_data(PVar37,PVar36,wVar8,(wchar_t)PVar29);
      ppiVar38 = clr;
      uVar39 = 0;
      do {
        Infoclr = (infoclr *)mem_zalloc(0x20);
        *ppiVar38 = Infoclr;
        uVar40 = (uint)uVar39 & 0x1f;
        uVar32 = (ulong)(uVar40 * 4);
        uVar30 = angband_color_table[0][uVar32 + 1];
        color_table_x11[0][uVar32] = angband_color_table[0][uVar32];
        color_table_x11[0][uVar32 + 1] = uVar30;
        uVar35 = angband_color_table[0][uVar32 + 2];
        PVar29 = CONCAT71((int7)(PVar29 >> 8),uVar35);
        color_table_x11[0][uVar32 + 2] = uVar35;
        bVar1 = angband_color_table[0][uVar32 + 3];
        color_table_x11[0][uVar32 + 3] = bVar1;
        PVar36 = metadpy_default_13;
        if ((metadpy_default_16 & 2) == 0) {
          PVar37 = metadpy_default_13;
          if (uVar39 != 0) {
            PVar37 = metadpy_default_14;
          }
          wVar8 = Infoclr_Opcode("cpy");
LAB_00123e2f:
          Infoclr_init_data(PVar37,PVar36,wVar8,(wchar_t)PVar29);
        }
        else {
          PVar29 = (Pixell)bVar1;
          uVar9 = create_pixel(metadpy_default_0,uVar30,uVar35,bVar1);
          PVar37 = (Pixell)uVar9;
          uVar10 = (uint)(uVar39 >> 5) & 0x7ffffff;
          uVar30 = color_table_x11[0x1c][2];
          uVar35 = color_table_x11[0x1c][1];
          bVar1 = color_table_x11[0x1c][3];
          if (uVar10 == 2) {
LAB_00123e15:
            PVar29 = (Pixell)bVar1;
            uVar9 = create_pixel(metadpy_default_0,uVar35,uVar30,bVar1);
            PVar36 = (ulong)uVar9;
LAB_00123e1d:
            wVar8 = Infoclr_Opcode("cpy");
            goto LAB_00123e2f;
          }
          if (uVar10 == 1) {
            uVar30 = color_table_x11[uVar40][2];
            uVar35 = color_table_x11[uVar40][1];
            bVar1 = color_table_x11[uVar40][3];
            goto LAB_00123e15;
          }
          PVar36 = metadpy_default_13;
          if ((uVar39 >> 5 & 0x7ffffff) == 0) goto LAB_00123e1d;
        }
        uVar39 = uVar39 + 1;
        ppiVar38 = ppiVar38 + 1;
      } while (uVar39 != 0x60);
      if (L'\0' < wVar13) {
        local_a28 = (ulong)(uint)wVar13;
        uVar39 = 0;
        do {
          strnfmt(buf_1,0x50,"ANGBAND_X11_FONT_%d",uVar39 & 0xffffffff);
          local_a48 = getenv(buf_1);
          if (((local_a48 == (char *)0x0) &&
              (local_a48 = getenv("ANGBAND_X11_FONT"), local_a48 == (char *)0x0)) &&
             (local_a48 = "9x15", uVar39 < 8)) {
            local_a48 = (char *)((long)&DAT_00259274 + (long)(int)(&DAT_00259274)[uVar39]);
          }
          t = data + uVar39;
          paVar15 = file_open(settings,MODE_READ,FTYPE_TEXT);
          if (paVar15 == (ang_file *)0x0) {
            iVar14 = 1;
            local_a64 = 0;
            local_a68 = L'P';
            local_a6c = L'\x18';
            iVar27 = 1;
            local_a70 = 0;
          }
          else {
            _Var7 = file_getl(paVar15,buf_1,0x400);
            if (_Var7) {
              iVar27 = 1;
              local_a6c = L'\x18';
              local_a68 = L'P';
              local_a70 = 0;
              local_a64 = 0;
              iVar14 = 1;
              do {
                uVar32 = (ulong)(byte)buf_1[0];
                if (((uVar32 != 0) && (ppuVar16 = __ctype_b_loc(), uVar32 != 0x23)) &&
                   (((*ppuVar16)[uVar32] & 0x2000) == 0)) {
                  strnfmt(cmd,0x28,"AT_X_%d",uVar39 & 0xffffffff);
                  _Var7 = prefix(buf_1,cmd);
                  if (_Var7) {
                    pcVar34 = strchr(buf_1,0x3d);
                    if (pcVar34 == (char *)0x0) {
                      local_a70 = -1;
                    }
                    else {
                      local_a70 = atoi(pcVar34 + 1);
                    }
                  }
                  else {
                    strnfmt(cmd,0x28,"AT_Y_%d",uVar39 & 0xffffffff);
                    _Var7 = prefix(buf_1,cmd);
                    if (_Var7) {
                      pcVar34 = strchr(buf_1,0x3d);
                      if (pcVar34 == (char *)0x0) {
                        local_a64 = -1;
                      }
                      else {
                        local_a64 = atoi(pcVar34 + 1);
                      }
                    }
                    else {
                      strnfmt(cmd,0x28,"COLS_%d",uVar39 & 0xffffffff);
                      _Var7 = prefix(buf_1,cmd);
                      if (_Var7) {
                        pcVar34 = strchr(buf_1,0x3d);
                        if (pcVar34 == (char *)0x0) {
                          wVar13 = L'\xffffffff';
                        }
                        else {
                          wVar13 = atoi(pcVar34 + 1);
                        }
                        if (L'\0' < wVar13) {
                          local_a68 = wVar13;
                        }
                      }
                      else {
                        strnfmt(cmd,0x28,"ROWS_%d",uVar39 & 0xffffffff);
                        _Var7 = prefix(buf_1,cmd);
                        if (_Var7) {
                          pcVar34 = strchr(buf_1,0x3d);
                          if (pcVar34 == (char *)0x0) {
                            wVar13 = L'\xffffffff';
                          }
                          else {
                            wVar13 = atoi(pcVar34 + 1);
                          }
                          if (L'\0' < wVar13) {
                            local_a6c = wVar13;
                          }
                        }
                        else {
                          strnfmt(cmd,0x28,"IBOX_%d",uVar39 & 0xffffffff);
                          _Var7 = prefix(buf_1,cmd);
                          if (_Var7) {
                            pcVar34 = strchr(buf_1,0x3d);
                            if (pcVar34 == (char *)0x0) {
                              iVar11 = -1;
                            }
                            else {
                              iVar11 = atoi(pcVar34 + 1);
                            }
                            if (0 < iVar11) {
                              iVar27 = iVar11;
                            }
                          }
                          else {
                            strnfmt(cmd,0x28,"IBOY_%d",uVar39 & 0xffffffff);
                            _Var7 = prefix(buf_1,cmd);
                            if (_Var7) {
                              pcVar34 = strchr(buf_1,0x3d);
                              if (pcVar34 == (char *)0x0) {
                                iVar11 = -1;
                              }
                              else {
                                iVar11 = atoi(pcVar34 + 1);
                              }
                              if (0 < iVar11) {
                                iVar14 = iVar11;
                              }
                            }
                            else {
                              strnfmt(cmd,0x28,"FONT_%d",uVar39 & 0xffffffff);
                              _Var7 = prefix(buf_1,cmd);
                              if (_Var7) {
                                pcVar34 = strchr(buf_1,0x3d);
                                if (pcVar34 != (char *)0x0) {
                                  my_strcpy(local_938,pcVar34 + 1,0x100);
                                  local_a48 = local_938;
                                }
                              }
                              else {
                                strnfmt(cmd,0x28,"TILE_WIDTH_%d",uVar39 & 0xffffffff);
                                _Var7 = prefix(buf_1,cmd);
                                if (_Var7) {
                                  pcVar34 = strchr(buf_1,0x3d);
                                  if (pcVar34 == (char *)0x0) {
                                    wVar13 = L'\xffffffff';
                                  }
                                  else {
                                    wVar13 = atoi(pcVar34 + 1);
                                  }
                                  if (L'\0' < wVar13) {
                                    data[uVar39].tile_wid = wVar13;
                                  }
                                }
                                else {
                                  strnfmt(cmd,0x28,"TILE_HEIGHT_%d",uVar39 & 0xffffffff);
                                  _Var7 = prefix(buf_1,cmd);
                                  if (_Var7) {
                                    pcVar34 = strchr(buf_1,0x3d);
                                    if (pcVar34 == (char *)0x0) {
                                      wVar13 = L'\xffffffff';
                                    }
                                    else {
                                      wVar13 = atoi(pcVar34 + 1);
                                    }
                                    if (L'\0' < wVar13) {
                                      data[uVar39].tile_hgt = wVar13;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                _Var7 = file_getl(paVar15,buf_1,0x400);
              } while (_Var7);
            }
            else {
              local_a64 = 0;
              local_a68 = L'P';
              local_a6c = L'\x18';
              iVar14 = 1;
              iVar27 = 1;
              local_a70 = 0;
            }
            file_close(paVar15);
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_AT_X_%d",uVar39 & 0xffffffff);
          pcVar34 = getenv(buf_1);
          iVar12 = -1;
          iVar11 = -1;
          if (pcVar34 != (char *)0x0) {
            iVar11 = atoi(pcVar34);
          }
          if (0 < iVar11) {
            local_a70 = iVar11;
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_AT_Y_%d",uVar39 & 0xffffffff);
          pcVar34 = getenv(buf_1);
          if (pcVar34 != (char *)0x0) {
            iVar12 = atoi(pcVar34);
          }
          if (0 < iVar12) {
            local_a64 = iVar12;
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_COLS_%d",uVar39 & 0xffffffff);
          pcVar34 = getenv(buf_1);
          wVar8 = L'\xffffffff';
          wVar13 = L'\xffffffff';
          if (pcVar34 != (char *)0x0) {
            wVar13 = atoi(pcVar34);
          }
          if (L'\0' < wVar13) {
            local_a68 = wVar13;
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_ROWS_%d",uVar39 & 0xffffffff);
          pcVar34 = getenv(buf_1);
          if (pcVar34 != (char *)0x0) {
            wVar8 = atoi(pcVar34);
          }
          if (L'\0' < wVar8) {
            local_a6c = wVar8;
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_IBOX_%d",uVar39 & 0xffffffff);
          pcVar34 = getenv(buf_1);
          iVar12 = -1;
          iVar11 = -1;
          if (pcVar34 != (char *)0x0) {
            iVar11 = atoi(pcVar34);
          }
          if (0 < iVar11) {
            iVar27 = iVar11;
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_IBOY_%d",uVar39 & 0xffffffff);
          pcVar34 = getenv(buf_1);
          if (pcVar34 != (char *)0x0) {
            iVar12 = atoi(pcVar34);
          }
          if (0 < iVar12) {
            iVar14 = iVar12;
          }
          strnfmt(buf_1,0x400,"ANGBAND_X11_FONT_%d",uVar39 & 0xffffffff);
          pcVar18 = getenv(buf_1);
          pcVar34 = local_a48;
          if (pcVar18 != (char *)0x0) {
            pcVar34 = pcVar18;
          }
          if (uVar39 == 0) {
            if (local_a68 < L'Q') {
              local_a68 = L'P';
            }
            if (local_a6c < L'\x19') {
              local_a6c = L'\x18';
            }
          }
          Infofnt = (infofnt *)mem_zalloc(0x20);
          data[uVar39].fnt = Infofnt;
          if ((pcVar34 == (char *)0x0) ||
             (p_Var19 = (XFontSet)
                        XCreateFontSet(metadpy_default_0,pcVar34,&missing,&missing_count,0),
             p_Var19 == (XFontSet)0x0)) {
            quit_fmt("Couldn\'t load the requested font. (%s)",pcVar34);
          }
          else {
            if (missing_count != L'\0') {
              XFreeStringList(missing);
            }
            piVar6 = Infofnt;
            piVar6->wid = 0;
            piVar6->twid = 0;
            piVar6->hgt = 0;
            piVar6->asc = 0;
            *(undefined8 *)&piVar6->off = 0;
            piVar6->fs = (XFontSet)0x0;
            piVar6->name = (char *)0x0;
            piVar6->fs = p_Var19;
            lVar20 = XExtentsOfFontSet(p_Var19);
            iVar11 = XFontsOfFontSet(p_Var19,res_name,res_class);
            piVar6->asc = 0;
            if (0 < iVar11) {
              iVar12 = 0;
              plVar4 = (long *)res_name._0_8_;
              do {
                res_name._0_8_ = plVar4 + 1;
                iVar3 = *(int *)(*plVar4 + 0x58);
                if ((short)iVar12 < iVar3) {
                  piVar6->asc = (int16_t)iVar3;
                  iVar12 = iVar3;
                }
                iVar11 = iVar11 + -1;
                plVar4 = (long *)res_name._0_8_;
              } while (iVar11 != 0);
            }
            piVar6->hgt = *(int16_t *)(lVar20 + 0xe);
            iVar2 = *(int16_t *)(lVar20 + 0xc);
            piVar6->wid = iVar2;
            piVar6->twid = iVar2;
            pcVar34 = string_make(pcVar34);
            piVar6 = Infofnt;
            Infofnt->name = pcVar34;
            piVar6->field_0x19 = piVar6->field_0x19 | 3;
          }
          if (data[uVar39].tile_wid < L'\x01') {
            data[uVar39].tile_wid = (int)(data[uVar39].fnt)->twid;
          }
          if (data[uVar39].tile_hgt < L'\x01') {
            data[uVar39].tile_hgt = (int)(data[uVar39].fnt)->hgt;
          }
          wVar13 = data[uVar39].tile_wid;
          data[uVar39].tile_wid2 = wVar13;
          wVar8 = data[uVar39].tile_hgt;
          piVar21 = (infowin *)mem_zalloc(0x28);
          data[uVar39].win = piVar21;
          PVar36 = metadpy_default_14;
          PVar29 = metadpy_default_13;
          Infowin = piVar21;
          piVar21->win = 0;
          piVar21->mask = 0;
          piVar21->ox = 0;
          piVar21->oy = 0;
          piVar21->x = 0;
          piVar21->y = 0;
          piVar21->x_save = 0;
          piVar21->y_save = 0;
          piVar21->w = 0;
          piVar21->h = 0;
          piVar21->b = 0;
          piVar21->byte1 = '\0';
          *(undefined5 *)&piVar21->field_0x23 = 0;
          WVar22 = XCreateSimpleWindow(metadpy_default_0,metadpy_default_2,local_a70,local_a64,
                                       wVar13 * local_a68 + iVar27 * 2,
                                       wVar8 * local_a6c + iVar14 * 2,0,PVar36,PVar29);
          XSelectInput(metadpy_default_0,WVar22,0);
          piVar21 = Infowin;
          Infowin->field_0x23 = Infowin->field_0x23 | 8;
          piVar21->win = WVar22;
          XGetGeometry(metadpy_default_0,WVar22,res_class,&missing,&missing_count,&w,&h,&b,local_a1c
                      );
          piVar21->x = (int16_t)missing;
          piVar21->y = (int16_t)missing_count;
          piVar21->x_save = (int16_t)missing;
          piVar21->y_save = (int16_t)missing_count;
          piVar21->w = (int16_t)w;
          piVar21->h = (int16_t)h;
          piVar21->b = (uint16_t)b;
          XGetWindowAttributes(metadpy_default_0,WVar22,res_name);
          piVar21->mask = local_990;
          piVar21->field_0x23 = piVar21->field_0x23 & 0xfc | local_99c != 0 | 2;
          piVar21 = Infowin;
          Infowin->mask = 0x28005;
          XSelectInput(metadpy_default_0,piVar21->win,0x28005);
          missing = (char **)res_name;
          my_strcpy(res_name,angband_term_name[uVar39],0x80);
          iVar11 = XStringListToTextProperty(&missing,1,res_class);
          if (iVar11 != 0) {
            XSetWMName(metadpy_default_0,Infowin->win,res_class);
          }
          XFree(res_class._0_8_);
          piVar21 = Infowin;
          Infowin->ox = (int16_t)iVar27;
          piVar21->oy = (int16_t)iVar14;
          pXVar23 = (XClassHint *)XAllocClassHint();
          if (pXVar23 == (XClassHint *)0x0) {
            quit("XAllocClassHint failed");
          }
          my_strcpy(res_name,angband_term_name[uVar39],0x14);
          pp_Var24 = __ctype_tolower_loc();
          res_name[0] = (char)(*pp_Var24)[res_name._0_8_ & 0xff];
          pXVar23->res_name = res_name;
          my_strcpy(res_class,"Angband",0x14);
          pXVar23->res_class = res_class;
          XSetClassHint(metadpy_default_0,Infowin->win,pXVar23);
          pXVar25 = (XSizeHints *)XAllocSizeHints();
          if (pXVar25 == (XSizeHints *)0x0) {
            quit("XAllocSizeHints failed");
          }
          wVar8 = iVar27 * 2;
          pXVar25->flags = (ulong)(local_a70 != 0 || local_a64 != 0) | 0x30;
          wVar13 = data[uVar39].tile_wid;
          if (uVar39 == 0) {
            pXVar25->min_width = wVar13 * 0x50 + wVar8;
            wVar28 = data[0].tile_hgt;
            wVar31 = wVar28 * 0x18;
          }
          else {
            pXVar25->min_width = wVar13 + wVar8;
            wVar31 = data[uVar39].tile_hgt;
            wVar28 = wVar31;
          }
          wVar5 = iVar14 * 2;
          pXVar25->min_height = wVar31 + wVar5;
          pXVar25->max_width = wVar13 * 0xff + wVar8;
          pXVar25->max_height = wVar28 * 0xff + wVar5;
          uVar32 = pXVar25->flags;
          pXVar25->flags = uVar32 | 0x40;
          pXVar25->width_inc = data[uVar39].tile_wid;
          pXVar25->height_inc = data[uVar39].tile_hgt;
          pXVar25->flags = uVar32 | 0x140;
          pXVar25->base_width = wVar8;
          pXVar25->base_height = wVar5;
          XSetWMNormalHints(metadpy_default_0,Infowin->win,pXVar25);
          pbVar26 = (byte *)XAllocWMHints();
          if (pbVar26 == (byte *)0x0) {
            quit("XAllocWMHints failed");
          }
          *pbVar26 = *pbVar26 | 0x40;
          *(Window *)(pbVar26 + 0x30) = (data[0].win)->win;
          XSetWMHints(metadpy_default_0,Infowin->win,pbVar26);
          XFree(pbVar26);
          XMapWindow(metadpy_default_0,Infowin->win);
          data[uVar39].sizeh = pXVar25;
          data[uVar39].classh = pXVar23;
          if ((-1 < local_a70) && (-1 < local_a64)) {
            XMoveWindow(metadpy_default_0,Infowin->win,local_a70,local_a64);
          }
          wVar13 = L'\x10';
          if (uVar39 == 0) {
            wVar13 = L'Ѐ';
          }
          term_init(&t->t,local_a68,local_a6c,wVar13);
          data[uVar39].t.soft_cursor = true;
          data[uVar39].t.complex_input = true;
          data[uVar39].t.xtra_hook = Term_xtra_x11;
          data[uVar39].t.curs_hook = Term_curs_x11;
          data[uVar39].t.bigcurs_hook = Term_bigcurs_x11;
          data[uVar39].t.wipe_hook = Term_wipe_x11;
          data[uVar39].t.text_hook = Term_text_x11;
          data[uVar39].t.data = t;
          Term_activate(&t->t);
          angband_term[uVar39] = Term;
          uVar39 = uVar39 + 1;
        } while (uVar39 != local_a28);
      }
      Infowin = data[0].win;
      XRaiseWindow(metadpy_default_0,(data[0].win)->win);
      Term_activate(&data[0].t);
      quit_aux = hook_quit;
      eVar33 = 0;
    }
  }
  return eVar33;
}

Assistant:

errr init_x11(int argc, char **argv)
{
	int i;

	const char *dpy_name = "";

	int num_term = -1;

	ang_file *fff;

	char buf[1024];
	const char *str;
	int val;

	/* Parse args */
	for (i = 1; i < argc; i++) {
		if (prefix(argv[i], "-d"))
		{
			dpy_name = &argv[i][2];
			continue;
		}

		if (prefix(argv[i], "-n")) {
			num_term = atoi(&argv[i][2]);
			if (num_term > MAX_TERM_DATA) num_term = MAX_TERM_DATA;
			else if (num_term < 1) num_term = 1;
			continue;
		}

		if (prefix(argv[i], "-x")) {
			x11_prefs = argv[i] + 2;
			continue;
		}

		plog_fmt("Ignoring option: %s", argv[i]);
	}


	if (num_term == -1) {
		num_term = 1;

		/* Build the filename */
		(void)path_build(settings, sizeof(settings), ANGBAND_DIR_USER,
						 "x11-settings.prf");

		/* Open the file */
		fff = file_open(settings, MODE_READ, FTYPE_TEXT);

		/* File exists */
		if (fff) {
			/* Process the file */
			while (file_getl(fff, buf, sizeof(buf))) {
				/* Skip "empty" lines */
				if (!buf[0]) continue;
	
				/* Skip "blank" lines */
				if (isspace((unsigned char)buf[0])) continue;
	
				/* Skip comments */
				if (buf[0] == '#') continue;
	
				/* Number of terminal windows */
				if (prefix(buf, "TERM_WINS")) {
					str = strstr(buf, "=");
					val = (str != NULL) ? atoi(str + 1) : -1;
					if (val > 0) num_term = val;
					continue;
				}
			}
	
			/* Close */
			(void)file_close(fff);
		}
	}


	/* Init the Metadpy if possible */
	if (Metadpy_init_name(dpy_name)) return (-1);

	/* Remember the number of terminal windows */
	term_windows_open = num_term;

	/* Prepare cursor color */
	xor = mem_zalloc(sizeof(infoclr));
	Infoclr_set(xor);
	Infoclr_init_ppn(Metadpy->fg, Metadpy->bg, "xor", 0);


	/* Prepare normal colors */
	for (i = 0; i < MAX_COLORS * BG_MAX; ++i) {
		Pixell pixel;

		clr[i] = mem_zalloc(sizeof(infoclr));

		Infoclr_set(clr[i]);

		/* Acquire Angband colors */
		color_table_x11[i % MAX_COLORS][0] =
			angband_color_table[i % MAX_COLORS][0];
		color_table_x11[i % MAX_COLORS][1] =
			angband_color_table[i % MAX_COLORS][1];
		color_table_x11[i % MAX_COLORS][2] =
			angband_color_table[i % MAX_COLORS][2];
		color_table_x11[i % MAX_COLORS][3] =
			angband_color_table[i % MAX_COLORS][3];

		/* Default to monochrome */
		pixel = ((i == 0) ? Metadpy->bg : Metadpy->fg);

		/* Handle color 
		   This block of code has added support for background colours
                   (from Sil) */
		if (Metadpy->color) {
			Pixell backpixel;
			/* Create pixel */
			pixel = create_pixel(Metadpy->dpy,
					     color_table_x11[i % MAX_COLORS][1],
					     color_table_x11[i % MAX_COLORS][2],
					     color_table_x11[i % MAX_COLORS][3]);
			switch (i / MAX_COLORS)
			{
				case BG_BLACK:
					/* Default Background */
					Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
					break;
				case BG_SAME:
					/* Background same as foreground */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[i % MAX_COLORS][1],
											 color_table_x11[i % MAX_COLORS][2],
											 color_table_x11[i % MAX_COLORS][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
				case BG_DARK:
					/* Highlight Background */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[COLOUR_SHADE][1],
											 color_table_x11[COLOUR_SHADE][2],
											 color_table_x11[COLOUR_SHADE][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
			}
		} else {
			/* Handle monochrome */
		    Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
		}
	}


	/* Initialize the windows */
	for (i = 0; i < num_term; i++) {
		term_data *td = &data[i];

		/* Initialize the term_data */
		term_data_init(td, i);

		/* Save global entry */
		angband_term[i] = Term;
	}

	/* Raise the "Angband" window */
	Infowin_set(data[0].win);
	Infowin_raise();

	/* Activate the "Angband" window screen */
	Term_activate(&data[0].t);


	/* Activate hook */
	quit_aux = hook_quit;

	/* Success */
	return (0);
}